

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

int Prs_CreateGetMemSize(char *pName)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  
  pcVar3 = strchr(pName,0x5f);
  pcVar4 = strchr(pcVar3 + 1,0x5f);
  iVar1 = atoi(pcVar3 + 1);
  uVar2 = atoi(pcVar4 + 1);
  uVar5 = uVar2;
  if (1 < uVar2) {
    uVar5 = 0;
    for (uVar6 = uVar2 - 1; uVar6 != 0; uVar6 = uVar6 >> 1) {
      uVar5 = uVar5 + 1;
    }
  }
  if ((int)(uVar5 + iVar1) < 0x20) {
    return uVar2 << ((byte)iVar1 & 0x1f);
  }
  __assert_fail("Num1 + Abc_Base2Log(Num2) < 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                ,0x6c4,"int Prs_CreateGetMemSize(char *)");
}

Assistant:

int Prs_CreateGetMemSize( char * pName )
{
    char * pPtr1 = strchr( pName, '_' );
    char * pPtr2 = strchr( pPtr1+1, '_' );
    int Num1 = atoi( pPtr1 + 1 );
    int Num2 = atoi( pPtr2 + 1 );
    assert( Num1 + Abc_Base2Log(Num2) < 32 );
    return (1 << Num1) * Num2;
}